

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

void __thiscall
cmSearchPath::AddPrefixPaths
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,char *base)

{
  cmMakefile *this_00;
  bool bVar1;
  char *__rhs;
  pointer __lhs;
  string subdir;
  string dir;
  string add;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->FC != (cmFindCommon *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"bin",(allocator<char> *)&local_b8);
    bVar1 = std::operator==(&this->FC->CMakePathName,"INCLUDE");
    if ((bVar1) || (bVar1 = std::operator==(&this->FC->CMakePathName,"LIBRARY"), bVar1)) {
      std::__cxx11::string::assign((char *)&local_d8);
    }
    else {
      bVar1 = std::operator==(&this->FC->CMakePathName,"FRAMEWORK");
      if (bVar1) {
        local_d8._M_string_length = 0;
        *local_d8._M_dataplus._M_p = '\0';
      }
    }
    local_98 = (paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (paths->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; __lhs != local_98; __lhs = __lhs + 1) {
      std::__cxx11::string::string((string *)&local_b8,(string *)__lhs);
      if (((local_d8._M_string_length != 0) && (local_b8._M_string_length != 0)) &&
         (local_b8._M_dataplus._M_p[local_b8._M_string_length - 1] != '/')) {
        std::__cxx11::string::append((char *)&local_b8);
      }
      bVar1 = std::operator==(&local_d8,"include");
      if ((bVar1) || (bVar1 = std::operator==(&local_d8,"lib"), bVar1)) {
        this_00 = (this->FC->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"CMAKE_LIBRARY_ARCHITECTURE",(allocator<char> *)&local_90);
        __rhs = cmMakefile::GetDefinition(this_00,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if ((__rhs != (char *)0x0) && (*__rhs != '\0')) {
          std::operator+(&local_50,&local_b8,&local_d8);
          std::operator+(&local_90,&local_50,"/");
          std::operator+(&local_70,&local_90,__rhs);
          AddPathInternal(this,&local_70,base);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      std::operator+(&local_70,&local_b8,&local_d8);
      bVar1 = std::operator!=(&local_70,"/");
      if (bVar1) {
        AddPathInternal(this,&local_70,base);
      }
      bVar1 = std::operator==(&local_d8,"bin");
      if (bVar1) {
        std::operator+(&local_90,&local_b8,"sbin");
        AddPathInternal(this,&local_90,base);
        std::__cxx11::string::~string((string *)&local_90);
      }
      if ((local_d8._M_string_length != 0) && (bVar1 = std::operator!=(__lhs,"/"), bVar1)) {
        AddPathInternal(this,__lhs,base);
      }
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::~string((string *)&local_d8);
    return;
  }
  __assert_fail("this->FC != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmSearchPath.cxx"
                ,0xa4,
                "void cmSearchPath::AddPrefixPaths(const std::vector<std::string> &, const char *)")
  ;
}

Assistant:

void cmSearchPath::AddPrefixPaths(const std::vector<std::string>& paths,
                                  const char* base)
{
  assert(this->FC != nullptr);

  // default for programs
  std::string subdir = "bin";

  if (this->FC->CMakePathName == "INCLUDE") {
    subdir = "include";
  } else if (this->FC->CMakePathName == "LIBRARY") {
    subdir = "lib";
  } else if (this->FC->CMakePathName == "FRAMEWORK") {
    subdir.clear(); // ? what to do for frameworks ?
  }

  for (std::string const& path : paths) {
    std::string dir = path;
    if (!subdir.empty() && !dir.empty() && dir.back() != '/') {
      dir += "/";
    }
    if (subdir == "include" || subdir == "lib") {
      const char* arch =
        this->FC->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE");
      if (arch && *arch) {
        this->AddPathInternal(dir + subdir + "/" + arch, base);
      }
    }
    std::string add = dir + subdir;
    if (add != "/") {
      this->AddPathInternal(add, base);
    }
    if (subdir == "bin") {
      this->AddPathInternal(dir + "sbin", base);
    }
    if (!subdir.empty() && path != "/") {
      this->AddPathInternal(path, base);
    }
  }
}